

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

bool is_exact_name(char *str,char *namelist)

{
  bool bVar1;
  long in_RSI;
  char *in_RDI;
  char name [4608];
  char in_stack_ffffffffffffede8;
  undefined7 in_stack_ffffffffffffede9;
  char *in_stack_ffffffffffffedf0;
  bool local_1;
  
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    do {
      one_argument(in_stack_ffffffffffffedf0,
                   (char *)CONCAT71(in_stack_ffffffffffffede9,in_stack_ffffffffffffede8));
      if (in_stack_ffffffffffffede8 == '\0') {
        return false;
      }
      bVar1 = str_cmp(in_RDI,&stack0xffffffffffffede8);
    } while (bVar1);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool is_exact_name(char *str, char *namelist)
{
	char name[MAX_INPUT_LENGTH];

	if (namelist == nullptr)
		return false;

	for (;;)
	{
		namelist = one_argument(namelist, name);

		if (name[0] == '\0')
			return false;
		if (!str_cmp(str, name))
			return true;
	}
}